

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

void __thiscall QFileDevicePrivate::setError(QFileDevicePrivate *this,FileError err)

{
  this->error = err;
  QString::clear(&(this->super_QIODevicePrivate).errorString);
  return;
}

Assistant:

void QFileDevicePrivate::setError(QFileDevice::FileError err)
{
    error = err;
    errorString.clear();
}